

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_array.h
# Opt level: O0

void __thiscall
tlm::tlm_array<tlm::tlm_extension_base_*>::free_entire_cache
          (tlm_array<tlm::tlm_extension_base_*> *this)

{
  size_type sVar1;
  reference puVar2;
  reference pptVar3;
  vector<tlm::tlm_extension_base_*,_std::allocator<tlm::tlm_extension_base_*>_> *in_RDI;
  
  while( true ) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1));
    if (sVar1 == 0) break;
    puVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
    pptVar3 = std::vector<tlm::tlm_extension_base_*,_std::allocator<tlm::tlm_extension_base_*>_>::
              operator[](in_RDI,*puVar2);
    if (*pptVar3 != (tlm_extension_base *)0x0) {
      puVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
      pptVar3 = std::vector<tlm::tlm_extension_base_*,_std::allocator<tlm::tlm_extension_base_*>_>::
                operator[](in_RDI,*puVar2);
      (**(code **)(*(long *)*pptVar3 + 8))();
    }
    puVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
    pptVar3 = std::vector<tlm::tlm_extension_base_*,_std::allocator<tlm::tlm_extension_base_*>_>::
              operator[](in_RDI,*puVar2);
    *pptVar3 = (tlm_extension_base *)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f66ec);
  }
  return;
}

Assistant:

void free_entire_cache()
    {
        while(m_entries.size())
        {
            if ((*this)[m_entries.back()])      //we make sure no one cleared the slot manually
              (*this)[m_entries.back()]->free();//...and then we call free on the content of the slot
            (*this)[m_entries.back()]=0;        //afterwards we set the slot to NULL
            m_entries.pop_back();
        }
    }